

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorProto::~FileDescriptorProto(FileDescriptorProto *this)

{
  ~FileDescriptorProto(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

FileDescriptorProto::~FileDescriptorProto() {
  // @@protoc_insertion_point(destructor:google.protobuf.FileDescriptorProto)
  SharedDtor();
}